

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O2

Subprocess * __thiscall SubprocessSet::Add(SubprocessSet *this,string *command,bool use_console)

{
  Subprocess *subprocess;
  
  subprocess = (Subprocess *)operator_new(0x30);
  (subprocess->buf_)._M_dataplus._M_p = (pointer)&(subprocess->buf_).field_2;
  (subprocess->buf_)._M_string_length = 0;
  (subprocess->buf_).field_2._M_local_buf[0] = '\0';
  subprocess->fd_ = -1;
  subprocess->pid_ = -1;
  subprocess->use_console_ = use_console;
  Subprocess::Start(subprocess,this,command);
  std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::push_back(&this->running_,&subprocess);
  return subprocess;
}

Assistant:

Subprocess *SubprocessSet::Add(const string& command, bool use_console) {
  Subprocess *subprocess = new Subprocess(use_console);
  if (!subprocess->Start(this, command)) {
    delete subprocess;
    return 0;
  }
  running_.push_back(subprocess);
  return subprocess;
}